

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

void __thiscall argstest::Command::Validate(Command *this,string *shortprefix,string *longprefix)

{
  pointer ppBVar1;
  Base *pBVar2;
  Subparser *pSVar3;
  Base **ppBVar4;
  int iVar5;
  __normal_iterator<argstest::Base_*const_*,_std::vector<argstest::Base_*,_std::allocator<argstest::Base_*>_>_>
  _Var6;
  pointer ppBVar7;
  anon_class_8_1_8991fb9c onValidationError;
  ostringstream problem;
  anon_class_8_1_8991fb9c local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar5 = (*(this->super_Group).super_Base._vptr_Base[2])();
  if ((char)iVar5 != '\0') {
    ppBVar1 = (this->super_Group).children.
              super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_1d0.this = this;
    for (ppBVar7 = (this->super_Group).children.
                   super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppBVar7 != ppBVar1; ppBVar7 = ppBVar7 + 1) {
      pBVar2 = *ppBVar7;
      iVar5 = (*pBVar2->_vptr_Base[6])(pBVar2);
      if ((char)iVar5 != '\0') {
        iVar5 = (*pBVar2->_vptr_Base[2])(pBVar2);
        if ((char)iVar5 == '\0') {
          Validate::anon_class_8_1_8991fb9c::operator()(&local_1d0);
        }
      }
      (*pBVar2->_vptr_Base[3])(pBVar2,shortprefix,longprefix);
    }
    pSVar3 = this->subparser;
    if (pSVar3 != (Subparser *)0x0) {
      (*(pSVar3->super_Group).super_Base._vptr_Base[3])(pSVar3,shortprefix,longprefix);
      iVar5 = (*(this->subparser->super_Group).super_Base._vptr_Base[2])();
      if ((char)iVar5 == '\0') {
        Validate::anon_class_8_1_8991fb9c::operator()(&local_1d0);
      }
    }
    if ((this->selectedCommand == (Command *)0x0) && (this->commandIsRequired == true)) {
      ppBVar4 = (this->super_Group).children.
                super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      _Var6 = std::
              __find_if<__gnu_cxx::__normal_iterator<argstest::Base*const*,std::vector<argstest::Base*,std::allocator<argstest::Base*>>>,__gnu_cxx::__ops::_Iter_pred<argstest::Group::HasCommand()const::_lambda(argstest::Base*)_1_>>
                        ((this->super_Group).children.
                         super__Vector_base<argstest::Base_*,_std::allocator<argstest::Base_*>_>.
                         _M_impl.super__Vector_impl_data._M_start,ppBVar4);
      if ((_Var6._M_current != ppBVar4) || (this->subparserHasCommand == true)) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Command is required",0x13);
        (this->super_Group).super_Base.error = Validation;
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&(this->super_Group).super_Base.errorMsg,(string *)local_1c8);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0]);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
      }
    }
  }
  return;
}

Assistant:

virtual void Validate(const std::string &shortprefix, const std::string &longprefix) const override
            {
                if (!Matched())
                {
                    return;
                }

                auto onValidationError = [&]
                {
                    std::ostringstream problem;
                    problem << "Group validation failed somewhere!";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                };

                for (Base *child: Children())
                {
                    if (child->IsGroup() && !child->Matched())
                    {
                        onValidationError();
                    }

                    child->Validate(shortprefix, longprefix);
                }

                if (subparser != nullptr)
                {
                    subparser->Validate(shortprefix, longprefix);
                    if (!subparser->Matched())
                    {
                        onValidationError();
                    }
                }

                if (selectedCommand == nullptr && commandIsRequired && (Group::HasCommand() || subparserHasCommand))
                {
                    std::ostringstream problem;
                    problem << "Command is required";
#ifdef ARGS_NOEXCEPT
                    error = Error::Validation;
                    errorMsg = problem.str();
#else
                    throw ValidationError(problem.str());
#endif
                }
            }